

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_asub_u_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  uint64_t uVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  uVar4 = msa_asub_u_df(0,(long)*(char *)pfVar2,(long)*(char *)pfVar3);
  *(char *)pfVar1 = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 1),(long)*(char *)((long)pfVar3 + 1));
  *(char *)((long)pfVar1 + 1) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 2),(long)*(char *)((long)pfVar3 + 2));
  *(char *)((long)pfVar1 + 2) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 3),(long)*(char *)((long)pfVar3 + 3));
  *(char *)((long)pfVar1 + 3) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 4),(long)*(char *)((long)pfVar3 + 4));
  *(char *)((long)pfVar1 + 4) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 5),(long)*(char *)((long)pfVar3 + 5));
  *(char *)((long)pfVar1 + 5) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 6),(long)*(char *)((long)pfVar3 + 6));
  *(char *)((long)pfVar1 + 6) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 7),(long)*(char *)((long)pfVar3 + 7));
  *(char *)((long)pfVar1 + 7) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 8),(long)*(char *)((long)pfVar3 + 8));
  *(char *)((long)pfVar1 + 8) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 9),(long)*(char *)((long)pfVar3 + 9));
  *(char *)((long)pfVar1 + 9) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 10),(long)*(char *)((long)pfVar3 + 10));
  *(char *)((long)pfVar1 + 10) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 0xb),(long)*(char *)((long)pfVar3 + 0xb));
  *(char *)((long)pfVar1 + 0xb) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 0xc),(long)*(char *)((long)pfVar3 + 0xc));
  *(char *)((long)pfVar1 + 0xc) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 0xd),(long)*(char *)((long)pfVar3 + 0xd));
  *(char *)((long)pfVar1 + 0xd) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 0xe),(long)*(char *)((long)pfVar3 + 0xe));
  *(char *)((long)pfVar1 + 0xe) = (char)uVar4;
  uVar4 = msa_asub_u_df(0,(long)*(char *)((long)pfVar2 + 0xf),(long)*(char *)((long)pfVar3 + 0xf));
  *(char *)((long)pfVar1 + 0xf) = (char)uVar4;
  return;
}

Assistant:

void helper_msa_asub_u_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_asub_u_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_asub_u_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_asub_u_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_asub_u_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_asub_u_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_asub_u_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_asub_u_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_asub_u_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_asub_u_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_asub_u_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_asub_u_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_asub_u_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_asub_u_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_asub_u_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_asub_u_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_asub_u_df(DF_BYTE, pws->b[15], pwt->b[15]);
}